

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O3

void read_customSec(wasm_reader *wr,module *m)

{
  uint32 uVar1;
  uint64 uVar2;
  custom_segment *pcVar3;
  byte *pbVar4;
  ulong __size;
  
  uVar2 = (*(wr->wr_op).read_uint64_from_leb128)(wr);
  uVar2 = uVar2 + wr->index;
  pcVar3 = (custom_segment *)malloc(0x20);
  m->custom_sec = pcVar3;
  m->custom_segment_count = m->custom_segment_count + 1;
  uVar1 = (*(wr->wr_op).read_uint32_from_leb128)(wr);
  pcVar3->name_size = uVar1;
  pbVar4 = (byte *)malloc((ulong)(uVar1 + 1));
  pcVar3->name = pbVar4;
  (*(wr->wr_op).read_string)(wr,pbVar4,(ulong)uVar1);
  __size = (ulong)(uint)((int)uVar2 - (int)wr->index);
  pbVar4 = (byte *)malloc(__size);
  pcVar3->data = pbVar4;
  (*(wr->wr_op).read_N_byte)(wr,pbVar4,__size);
  check_index(wr,uVar2,"read custom_segment failure");
  return;
}

Assistant:

void read_customSec(wasm_reader *wr, module *m) {
    uint64 right_index;
    uint64 sec_size = wr->wr_op.read_uint64_from_leb128(wr);
    right_index = sec_size + wr->index;
    m->custom_sec = malloc(sizeof(struct custom_segment));
    m->custom_segment_count++;
    custom_segment *cs = m->custom_sec;
    cs->next = m->custom_sec->next;
    cs->name_size = wr->wr_op.read_uint32_from_leb128(wr);
    cs->name = malloc(cs->name_size + 1);
    wr->wr_op.read_string(wr, cs->name, cs->name_size);
    uint data_size = right_index - wr->index;
    cs->data = malloc(sizeof(byte) * data_size);
    wr->wr_op.read_N_byte(wr, cs->data, data_size);
    check_index(wr, right_index, "read custom_segment failure");
}